

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5CursorFirstSorted(Fts5FullTable *pTab,Fts5Cursor *pCsr,int bDesc)

{
  u64 n;
  Fts5Config *pConfig;
  char *pcVar1;
  int iVar2;
  int iVar3;
  Fts5Sorter *ppStmt;
  char *zFmt;
  char *pcVar4;
  char *pcVar5;
  
  if (pCsr->pExpr == (Fts5Expr *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = pCsr->pExpr->nPhrase;
  }
  pConfig = (pTab->p).pConfig;
  pcVar1 = pCsr->zRank;
  pcVar5 = pCsr->zRankArgs;
  n = (long)iVar3 * 4 + 0x1c;
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    ppStmt = (Fts5Sorter *)sqlite3Malloc(n);
  }
  else {
    ppStmt = (Fts5Sorter *)0x0;
  }
  if (ppStmt == (Fts5Sorter *)0x0) {
    iVar3 = 7;
  }
  else {
    memset(ppStmt,0,n);
    ppStmt->nIdx = iVar3;
    zFmt = ", ";
    if (pcVar5 == (char *)0x0) {
      zFmt = "";
    }
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "";
    }
    pcVar4 = "DESC";
    if (bDesc == 0) {
      pcVar4 = "ASC";
    }
    iVar3 = fts5PrepareStatement
                      (&ppStmt->pStmt,pConfig,zFmt,pConfig->zDb,pConfig->zName,pcVar1,pConfig->zName
                       ,zFmt,pcVar5,pcVar4);
    pCsr->pSorter = ppStmt;
    if (iVar3 == 0) {
      pTab->pSortCsr = pCsr;
      iVar3 = fts5SorterNext(pCsr);
      pTab->pSortCsr = (Fts5Cursor *)0x0;
    }
    if (iVar3 != 0) {
      sqlite3_finalize(ppStmt->pStmt);
      sqlite3_free(ppStmt);
      pCsr->pSorter = (Fts5Sorter *)0x0;
    }
  }
  return iVar3;
}

Assistant:

static int fts5CursorFirstSorted(
  Fts5FullTable *pTab, 
  Fts5Cursor *pCsr, 
  int bDesc
){
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Sorter *pSorter;
  int nPhrase;
  sqlite3_int64 nByte;
  int rc;
  const char *zRank = pCsr->zRank;
  const char *zRankArgs = pCsr->zRankArgs;
  
  nPhrase = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  nByte = sizeof(Fts5Sorter) + sizeof(int) * (nPhrase-1);
  pSorter = (Fts5Sorter*)sqlite3_malloc64(nByte);
  if( pSorter==0 ) return SQLITE_NOMEM;
  memset(pSorter, 0, (size_t)nByte);
  pSorter->nIdx = nPhrase;

  /* TODO: It would be better to have some system for reusing statement
  ** handles here, rather than preparing a new one for each query. But that
  ** is not possible as SQLite reference counts the virtual table objects.
  ** And since the statement required here reads from this very virtual 
  ** table, saving it creates a circular reference.
  **
  ** If SQLite a built-in statement cache, this wouldn't be a problem. */
  rc = fts5PrepareStatement(&pSorter->pStmt, pConfig,
      "SELECT rowid, rank FROM %Q.%Q ORDER BY %s(%s%s%s) %s",
      pConfig->zDb, pConfig->zName, zRank, pConfig->zName,
      (zRankArgs ? ", " : ""),
      (zRankArgs ? zRankArgs : ""),
      bDesc ? "DESC" : "ASC"
  );

  pCsr->pSorter = pSorter;
  if( rc==SQLITE_OK ){
    assert( pTab->pSortCsr==0 );
    pTab->pSortCsr = pCsr;
    rc = fts5SorterNext(pCsr);
    pTab->pSortCsr = 0;
  }

  if( rc!=SQLITE_OK ){
    sqlite3_finalize(pSorter->pStmt);
    sqlite3_free(pSorter);
    pCsr->pSorter = 0;
  }

  return rc;
}